

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>::
emplace_value<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>::slot_type*>
          (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
           *this,size_type i,allocator_type *alloc,slot_type **args)

{
  btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
  bVar1;
  ulong uVar2;
  long lVar3;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *c;
  long lVar4;
  long lVar5;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar2 = (ulong)(byte)this[10];
  if (i <= (long)uVar2) {
    if (i < (long)uVar2) {
      *(undefined4 *)(this + uVar2 * 4 + 0xc) = *(undefined4 *)(this + uVar2 * 4 + 8);
      lVar4 = uVar2 - 1;
      if (i < lVar4) {
        lVar3 = uVar2 << 0x20;
        lVar5 = lVar3 + -0x200000000;
        do {
          lVar3 = lVar3 + -0x100000000;
          *(undefined4 *)(this + (lVar3 >> 0x1e) + 0xc) =
               *(undefined4 *)(this + (lVar5 >> 0x1e) + 0xc);
          lVar4 = lVar4 + -1;
          lVar5 = lVar5 + -0x100000000;
        } while (i < lVar4);
      }
    }
    *(value_type_conflict2 *)(this + (long)(int)i * 4 + 0xc) = (*args)->value;
    bVar1 = this[10];
    this[10] = (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                )((char)bVar1 + 1U);
    if (this[0xb] ==
        (btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
         )0x0) {
      uVar2 = (ulong)(byte)((char)bVar1 + 1U);
      lVar4 = i + 1;
      if (lVar4 < (long)uVar2) {
        while (lVar4 < (long)uVar2) {
          c = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::child((btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       *)this,(int)(uVar2 - 1));
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::set_child((btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       *)this,(int)uVar2,c);
          uVar2 = uVar2 - 1;
        }
        btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        ::mutable_child((btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                         *)this,(int)lVar4);
        return;
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5d5,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>, Args = <gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>::slot_type *>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                         allocator_type *alloc,
                                         Args &&... args) {
  assert(i <= count());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < count()) {
    value_init(count(), alloc, slot(count() - 1));
    for (size_type j = count() - 1; j > i; --j)
      slot_type::move(alloc, slot(j - 1), slot(j));
    value_destroy(i, alloc);
  }
  value_init(i, alloc, std::forward<Args>(args)...);
  set_count(count() + 1);

  if (!leaf() && count() > i + 1) {
    for (int j = count(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}